

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

xmlChar * xmlSchemaGetComponentDesignation(xmlChar **buf,void *item)

{
  xmlChar *pxVar1;
  xmlChar *pxVar2;
  xmlChar *local_28;
  
  local_28 = (xmlChar *)0x0;
  pxVar2 = *buf;
  pxVar1 = xmlSchemaGetComponentTypeStr((xmlSchemaBasicItemPtr)item);
  pxVar2 = xmlStrcat(pxVar2,pxVar1);
  *buf = pxVar2;
  pxVar2 = xmlStrcat(pxVar2," \'");
  *buf = pxVar2;
  pxVar1 = xmlSchemaGetComponentQName(&local_28,item);
  pxVar2 = xmlStrcat(pxVar2,pxVar1);
  *buf = pxVar2;
  pxVar2 = xmlStrcat(pxVar2,"\'");
  *buf = pxVar2;
  if (local_28 != (xmlChar *)0x0) {
    (*xmlFree)(local_28);
    pxVar2 = *buf;
  }
  return pxVar2;
}

Assistant:

static const xmlChar*
xmlSchemaGetComponentDesignation(xmlChar **buf, void *item)
{
    xmlChar *str = NULL;

    *buf = xmlStrcat(*buf, WXS_ITEM_TYPE_NAME(item));
    *buf = xmlStrcat(*buf, BAD_CAST " '");
    *buf = xmlStrcat(*buf, xmlSchemaGetComponentQName(&str,
	(xmlSchemaBasicItemPtr) item));
    *buf = xmlStrcat(*buf, BAD_CAST "'");
    FREE_AND_NULL(str);
    return(*buf);
}